

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::add_sample
          (TypedTimeSamples<std::vector<double,_std::allocator<double>_>_> *this,double t,
          vector<double,_std::allocator<double>_> *v)

{
  Sample s;
  Sample local_38;
  
  local_38.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._0_1_ = 0;
  local_38._25_8_ = 0;
  local_38.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_38.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish._0_1_ = 0;
  local_38.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish._1_7_ = 0;
  local_38.t = t;
  ::std::vector<double,_std::allocator<double>_>::operator=(&local_38.value,v);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample>>
              *)this,&local_38);
  this->_dirty = true;
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_38.value.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }